

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_ru_u_access<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>
               (void)

{
  uint uVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  node_ptr plVar4;
  node_ptr plVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  pointer pvVar18;
  pool<boost::default_user_allocator_malloc_free> *ppVar19;
  _Base_ptr p_Var20;
  pointer p;
  _Hash_node_base *p_Var21;
  ulong uVar22;
  pointer p_1;
  pointer p_00;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  uColumns;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  orderedBoundaries;
  Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>
  m;
  shared_count sStack_460;
  char *local_458;
  _Base_ptr local_450;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_448;
  undefined **local_428;
  undefined1 local_420;
  _Base_ptr local_418;
  _Base_ptr local_410;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_3f8;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  pool<boost::default_user_allocator_malloc_free> *local_2c0;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
  local_2b8;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>>
            ();
  local_2c0 = (pool<boost::default_user_allocator_malloc_free> *)operator_new(0x38);
  (((Entry_constructor *)&local_2c0->super_simple_segregated_storage<unsigned_long>)->entryPool_).
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (local_2c0->list).ptr = (char *)0x0;
  (local_2c0->list).sz = 0;
  local_2c0->requested_size = 0x18;
  local_2c0->next_size = 0x20;
  local_2c0->start_size = 0x20;
  local_2c0->max_size = 0;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>
  ::RU_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>
              *)&local_2b8,&local_3f8,(Column_settings *)local_2c0);
  local_448.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_448.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_448.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var20 = (_Base_ptr)operator_new(0xa8);
  local_448.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var20;
  local_448.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&p_Var20[5]._M_parent;
  memset(p_Var20,0,0xa8);
  local_428._0_4_ = 0;
  local_448.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&p_Var20[5]._M_parent;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)p_Var20,&local_428);
  local_428._0_4_ = 1;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             ((long)local_448.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 0x18),&local_428);
  local_428 = (undefined **)CONCAT44(local_428._4_4_,2);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             &((_Base_ptr)
              ((long)local_448.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 0x20))->_M_left,&local_428);
  local_428 = (undefined **)0x500000003;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             &((_Base_ptr)
              ((long)local_448.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 0x40))->_M_parent,&local_428);
  local_428 = (undefined **)0x500000004;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             ((long)local_448.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 0x60),&local_428);
  local_428._0_4_ = 5;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             &((_Base_ptr)
              ((long)local_448.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 0x60))->_M_right,&local_428);
  local_428 = (undefined **)CONCAT44(local_428._4_4_,6);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             &((_Base_ptr)
              ((long)local_448.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 0x80))->_M_left,&local_428);
  pvVar18 = local_448.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_448.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_448.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar22 = 0;
    p_Var20 = (_Base_ptr)
              local_448.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (local_2b8.mirrorMatrixU_.
          super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
          .rowSwapped_ == true) {
        Gudhi::persistence_matrix::
        Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>_>
        ::_orderRows(&local_2b8.mirrorMatrixU_.
                      super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
                    );
      }
      if (local_2b8.mirrorMatrixU_.matrix_._M_h._M_buckets
          [uVar22 % local_2b8.mirrorMatrixU_.matrix_._M_h._M_bucket_count] == (__node_base_ptr)0x0)
      {
LAB_001810bd:
        std::__throw_out_of_range("_Map_base::at");
      }
      p_Var2 = local_2b8.mirrorMatrixU_.matrix_._M_h._M_buckets
               [uVar22 % local_2b8.mirrorMatrixU_.matrix_._M_h._M_bucket_count]->_M_nxt;
      uVar1 = *(uint *)&p_Var2[1]._M_nxt;
      while ((uint)uVar22 != uVar1) {
        p_Var2 = p_Var2->_M_nxt;
        if ((p_Var2 == (_Hash_node_base *)0x0) ||
           (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
           (ulong)uVar1 % local_2b8.mirrorMatrixU_.matrix_._M_h._M_bucket_count !=
           uVar22 % local_2b8.mirrorMatrixU_.matrix_._M_h._M_bucket_count)) goto LAB_001810bd;
      }
      get_column_content_via_iterators<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>>
                ((column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>_>
                  *)&local_428,
                 (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
                  *)(p_Var2 + 2));
      test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>>
                ((witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>_>
                  *)p_Var20,
                 (column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>_>
                  *)&local_428);
      uVar22 = (ulong)((uint)uVar22 + 1);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&local_428);
      p_Var20 = (_Base_ptr)&p_Var20->_M_right;
    } while (p_Var20 != (_Base_ptr)pvVar18);
  }
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2c8 = "";
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2d0,0x296);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_2b8.mirrorMatrixU_.matrix_._M_h._M_bucket_count;
  uVar22 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar6,0);
  if (local_2b8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar22 & 0xffffffff] != (__node_base_ptr)0x0)
  {
    p_Var2 = local_2b8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar22 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    while (uVar1 != 3) {
      p_Var2 = p_Var2->_M_nxt;
      if ((p_Var2 == (_Hash_node_base *)0x0) ||
         (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
         (ulong)uVar1 % local_2b8.mirrorMatrixU_.matrix_._M_h._M_bucket_count != uVar22))
      goto LAB_001810d5;
    }
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_2b8.mirrorMatrixU_.
                   super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
                   .indexToRow_._M_h._M_bucket_count;
    uVar22 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(5)) % auVar7,0);
    if (local_2b8.mirrorMatrixU_.
        super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
        .indexToRow_._M_h._M_buckets[uVar22 & 0xffffffff] != (__node_base_ptr)0x0) {
      p_Var3 = local_2b8.mirrorMatrixU_.
               super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
               .indexToRow_._M_h._M_buckets[uVar22 & 0xffffffff]->_M_nxt;
      uVar1 = *(uint *)&p_Var3[1]._M_nxt;
      goto joined_r0x001807ca;
    }
  }
  goto LAB_001810d5;
joined_r0x001809ea:
  if (uVar1 == 3) {
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         local_2b8.mirrorMatrixU_.
         super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
         .indexToRow_._M_h._M_bucket_count;
    uVar22 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(5)) % auVar10,0);
    if (local_2b8.mirrorMatrixU_.
        super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
        .indexToRow_._M_h._M_buckets[uVar22 & 0xffffffff] != (__node_base_ptr)0x0) {
      p_Var3 = local_2b8.mirrorMatrixU_.
               super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
               .indexToRow_._M_h._M_buckets[uVar22 & 0xffffffff]->_M_nxt;
      uVar1 = *(uint *)&p_Var3[1]._M_nxt;
      goto joined_r0x00180a45;
    }
    goto LAB_001810c9;
  }
  p_Var2 = p_Var2->_M_nxt;
  if ((p_Var2 == (_Hash_node_base *)0x0) ||
     (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
     (ulong)uVar1 % local_2b8.mirrorMatrixU_.matrix_._M_h._M_bucket_count != uVar22))
  goto LAB_001810c9;
  goto joined_r0x001809ea;
  while ((p_Var3 = p_Var3->_M_nxt, p_Var3 != (_Hash_node_base *)0x0 &&
         (uVar1 = *(uint *)&p_Var3[1]._M_nxt,
         (ulong)uVar1 %
         local_2b8.mirrorMatrixU_.
         super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
         .indexToRow_._M_h._M_bucket_count == uVar22))) {
joined_r0x00180a45:
    if (uVar1 == 5) {
      p_00 = (pointer)(p_Var2 + 5);
      goto LAB_00180a78;
    }
  }
  goto LAB_001810c9;
  while( true ) {
    if (p_00 == (pointer)0x0) goto LAB_001810f9;
    if (p_00->rowIndex_ == *(ID_index *)((long)&p_Var3[1]._M_nxt + 4)) break;
LAB_00180a78:
    p_00 = (pointer)(p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_;
    if (p_00 == (pointer)(p_Var2 + 5)) goto LAB_00180aab;
  }
  plVar4 = (p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_;
  plVar5 = (p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_;
  plVar5->next_ = plVar4;
  plVar4->prev_ = plVar5;
  (p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
  (p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
  Gudhi::
  Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>_>
  ::destroy((Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>_>
             *)p_Var2[4]._M_nxt,p_00);
LAB_00180aab:
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_328 = "";
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_330,0x299);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_2b8.mirrorMatrixU_.matrix_._M_h._M_bucket_count;
  uVar22 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar11,0);
  if (local_2b8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar22 & 0xffffffff] != (__node_base_ptr)0x0)
  {
    p_Var2 = local_2b8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar22 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    while (uVar1 != 3) {
      p_Var2 = p_Var2->_M_nxt;
      if ((p_Var2 == (_Hash_node_base *)0x0) ||
         (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
         (ulong)uVar1 % local_2b8.mirrorMatrixU_.matrix_._M_h._M_bucket_count != uVar22))
      goto LAB_001810e1;
    }
    auVar12._8_8_ = 0;
    auVar12._0_8_ =
         local_2b8.mirrorMatrixU_.
         super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
         .indexToRow_._M_h._M_bucket_count;
    uVar22 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(5)) % auVar12,0);
    if (local_2b8.mirrorMatrixU_.
        super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
        .indexToRow_._M_h._M_buckets[uVar22 & 0xffffffff] != (__node_base_ptr)0x0) {
      p_Var3 = local_2b8.mirrorMatrixU_.
               super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
               .indexToRow_._M_h._M_buckets[uVar22 & 0xffffffff]->_M_nxt;
      uVar1 = *(uint *)&p_Var3[1]._M_nxt;
      goto joined_r0x00180b68;
    }
  }
  goto LAB_001810e1;
joined_r0x00180e1b:
  if (uVar1 == 3) {
    auVar16._8_8_ = 0;
    auVar16._0_8_ =
         local_2b8.mirrorMatrixU_.
         super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
         .indexToRow_._M_h._M_bucket_count;
    uVar22 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(5)) % auVar16,0);
    if (local_2b8.mirrorMatrixU_.
        super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
        .indexToRow_._M_h._M_buckets[uVar22 & 0xffffffff] != (__node_base_ptr)0x0) {
      p_Var3 = local_2b8.mirrorMatrixU_.
               super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
               .indexToRow_._M_h._M_buckets[uVar22 & 0xffffffff]->_M_nxt;
      uVar1 = *(uint *)&p_Var3[1]._M_nxt;
      goto joined_r0x00180e76;
    }
    goto LAB_001810ed;
  }
  p_Var2 = p_Var2->_M_nxt;
  if ((p_Var2 == (_Hash_node_base *)0x0) ||
     (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
     (ulong)uVar1 % local_2b8.mirrorMatrixU_.matrix_._M_h._M_bucket_count != uVar22))
  goto LAB_001810ed;
  goto joined_r0x00180e1b;
joined_r0x00180e76:
  if (uVar1 == 5) {
    p_Var21 = p_Var2 + 5;
    goto LAB_00180ea9;
  }
  p_Var3 = p_Var3->_M_nxt;
  if ((p_Var3 == (_Hash_node_base *)0x0) ||
     (uVar1 = *(uint *)&p_Var3[1]._M_nxt,
     (ulong)uVar1 %
     local_2b8.mirrorMatrixU_.
     super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
     .indexToRow_._M_h._M_bucket_count != uVar22)) {
LAB_001810ed:
    std::__throw_out_of_range("_Map_base::at");
  }
  goto joined_r0x00180e76;
  while( true ) {
    if (p_Var21 == (_Hash_node_base *)0x0) goto LAB_001810f9;
    if (*(int *)&p_Var21[2]._M_nxt == *(int *)((long)&p_Var3[1]._M_nxt + 4)) break;
LAB_001807fd:
    p_Var21 = p_Var21->_M_nxt;
    if (p_Var21 == p_Var2 + 5) break;
  }
  sStack_460.pi_ = (sp_counted_base *)0x0;
  local_458 = "!m.is_zero_entry(3, 5, false)";
  local_450 = (_Base_ptr)0x1ef709;
  local_420 = _S_red;
  local_428 = &PTR__lazy_ostream_00231438;
  local_418 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2e8 = "";
  local_410 = (_Base_ptr)&local_458;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_460);
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2f8 = "";
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_300,0x297);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_2b8.mirrorMatrixU_.matrix_._M_h._M_bucket_count;
  uVar22 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar8,0);
  if (local_2b8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar22 & 0xffffffff] != (__node_base_ptr)0x0)
  {
    p_Var2 = local_2b8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar22 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 4) {
        sStack_460.pi_ = (sp_counted_base *)0x0;
        local_458 = "!m.is_zero_column(4, false)";
        local_450 = (_Base_ptr)0x1ef725;
        local_420 = _S_red;
        local_428 = &PTR__lazy_ostream_00231438;
        local_418 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_320 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_318 = "";
        local_410 = (_Base_ptr)&local_458;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_460);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = local_2b8.mirrorMatrixU_.matrix_._M_h._M_bucket_count;
        uVar22 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar9,0);
        if (local_2b8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar22 & 0xffffffff] ==
            (__node_base_ptr)0x0) goto LAB_001810c9;
        p_Var2 = local_2b8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar22 & 0xffffffff]->_M_nxt;
        uVar1 = *(uint *)&p_Var2[1]._M_nxt;
        goto joined_r0x001809ea;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
            (ulong)uVar1 % local_2b8.mirrorMatrixU_.matrix_._M_h._M_bucket_count == uVar22));
  }
  std::__throw_out_of_range("_Map_base::at");
  while( true ) {
    if (p_Var21 == (_Hash_node_base *)0x0) goto LAB_001810f9;
    if (*(int *)&p_Var21[2]._M_nxt == *(int *)((long)&p_Var3[1]._M_nxt + 4)) break;
LAB_00180b9b:
    p_Var21 = p_Var21->_M_nxt;
    if (p_Var21 == p_Var2 + 5) break;
  }
  sStack_460.pi_ = (sp_counted_base *)0x0;
  local_458 = "m.is_zero_entry(3, 5, false)";
  local_450 = (_Base_ptr)0x1ef709;
  local_420 = _S_red;
  local_428 = &PTR__lazy_ostream_00231438;
  local_418 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_348 = "";
  local_410 = (_Base_ptr)&local_458;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_460);
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_358 = "";
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_360,0x29a);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_2b8.mirrorMatrixU_.matrix_._M_h._M_bucket_count;
  uVar22 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar13,0);
  if (local_2b8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar22 & 0xffffffff] != (__node_base_ptr)0x0)
  {
    p_Var2 = local_2b8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar22 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 4) {
        sStack_460.pi_ = (sp_counted_base *)0x0;
        local_458 = "!m.is_zero_column(4, false)";
        local_450 = (_Base_ptr)0x1ef725;
        local_420 = _S_red;
        local_428 = &PTR__lazy_ostream_00231438;
        local_418 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_380 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_378 = "";
        local_410 = (_Base_ptr)&local_458;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_460);
        auVar14._8_8_ = 0;
        auVar14._0_8_ = local_2b8.mirrorMatrixU_.matrix_._M_h._M_bucket_count;
        uVar22 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar14,0);
        if (local_2b8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar22 & 0xffffffff] ==
            (__node_base_ptr)0x0) goto LAB_001810c9;
        p_Var2 = local_2b8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar22 & 0xffffffff]->_M_nxt;
        uVar1 = *(uint *)&p_Var2[1]._M_nxt;
        goto joined_r0x00180d85;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
            (ulong)uVar1 % local_2b8.mirrorMatrixU_.matrix_._M_h._M_bucket_count == uVar22));
  }
  std::__throw_out_of_range("_Map_base::at");
LAB_00180ea9:
  do {
    p_Var21 = p_Var21->_M_nxt;
    if (p_Var21 == p_Var2 + 5) break;
    if (p_Var21 == (_Hash_node_base *)0x0) {
LAB_001810f9:
      __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                    "static pointer boost::intrusive::bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, true, false, true>>>, boost::intrusive::list_node<void *> *, Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, true, false, true>>::Matrix_column_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, true, false, true>>>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, true, false, true>>::Matrix_column_tag, Type = 1]"
                   );
    }
  } while (*(int *)&p_Var21[2]._M_nxt != *(int *)((long)&p_Var3[1]._M_nxt + 4));
  sStack_460.pi_ = (sp_counted_base *)0x0;
  local_458 = "m.is_zero_entry(3, 5, false)";
  local_450 = (_Base_ptr)0x1ef709;
  local_420 = _S_red;
  local_428 = &PTR__lazy_ostream_00231438;
  local_418 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3a8 = "";
  local_410 = (_Base_ptr)&local_458;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_460);
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3b8 = "";
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3c0,0x29d);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_2b8.mirrorMatrixU_.matrix_._M_h._M_bucket_count;
  uVar22 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar17,0);
  if (local_2b8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar22 & 0xffffffff] != (__node_base_ptr)0x0)
  {
    p_Var2 = local_2b8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar22 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 4) {
        sStack_460.pi_ = (sp_counted_base *)0x0;
        local_458 = "m.is_zero_column(4, false)";
        local_450 = (_Base_ptr)0x1ef725;
        local_420 = _S_red;
        local_428 = &PTR__lazy_ostream_00231438;
        local_418 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_3e0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_3d8 = "";
        local_410 = (_Base_ptr)&local_458;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_460);
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::~vector(&local_448);
        Gudhi::persistence_matrix::
        RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
        ::reset(&local_2b8,(Column_settings *)local_2c0);
        ppVar19 = local_2c0;
        if (local_2c0 != (pool<boost::default_user_allocator_malloc_free> *)0x0) {
          boost::pool<boost::default_user_allocator_malloc_free>::purge_memory(local_2c0);
        }
        operator_delete(ppVar19,0x38);
        Gudhi::persistence_matrix::
        RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
        ::~RU_matrix(&local_2b8);
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::~vector(&local_3f8);
        return;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
            (ulong)uVar1 % local_2b8.mirrorMatrixU_.matrix_._M_h._M_bucket_count == uVar22));
  }
  std::__throw_out_of_range("_Map_base::at");
  while ((p_Var3 = p_Var3->_M_nxt, p_Var3 != (_Hash_node_base *)0x0 &&
         (uVar1 = *(uint *)&p_Var3[1]._M_nxt,
         (ulong)uVar1 %
         local_2b8.mirrorMatrixU_.
         super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
         .indexToRow_._M_h._M_bucket_count == uVar22))) {
joined_r0x00180b68:
    if (uVar1 == 5) {
      p_Var21 = p_Var2 + 5;
      goto LAB_00180b9b;
    }
  }
LAB_001810e1:
  std::__throw_out_of_range("_Map_base::at");
  while ((p_Var2 = p_Var2->_M_nxt, p_Var2 != (_Hash_node_base *)0x0 &&
         (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
         (ulong)uVar1 % local_2b8.mirrorMatrixU_.matrix_._M_h._M_bucket_count == uVar22))) {
joined_r0x00180d85:
    if (uVar1 == 4) {
      boost::intrusive::
      list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
      ::
      clear_and_dispose<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>::Delete_disposer>
                ((list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
                  *)(p_Var2 + 5),
                 (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
                  *)(p_Var2 + 2));
      local_390 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_388 = "";
      local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_398 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_390,0x29c);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_2b8.mirrorMatrixU_.matrix_._M_h._M_bucket_count;
      uVar22 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar15,0);
      if (local_2b8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar22 & 0xffffffff] ==
          (__node_base_ptr)0x0) goto LAB_001810ed;
      p_Var2 = local_2b8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar22 & 0xffffffff]->_M_nxt;
      uVar1 = *(uint *)&p_Var2[1]._M_nxt;
      goto joined_r0x00180e1b;
    }
  }
LAB_001810c9:
  std::__throw_out_of_range("_Map_base::at");
  while ((p_Var3 = p_Var3->_M_nxt, p_Var3 != (_Hash_node_base *)0x0 &&
         (uVar1 = *(uint *)&p_Var3[1]._M_nxt,
         (ulong)uVar1 %
         local_2b8.mirrorMatrixU_.
         super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_false,_true,_true,_false,_true>_>_>_>
         .indexToRow_._M_h._M_bucket_count == uVar22))) {
joined_r0x001807ca:
    if (uVar1 == 5) {
      p_Var21 = p_Var2 + 5;
      goto LAB_001807fd;
    }
  }
LAB_001810d5:
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

void test_ru_u_access() {
  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(orderedBoundaries, 5);

  std::vector<witness_content<typename Matrix::Column> > uColumns(7);
  if constexpr (Matrix::Option_list::is_z2) {
    uColumns[0] = {0};
    uColumns[1] = {1};
    uColumns[2] = {2};
    uColumns[3] = {3, 5};
    uColumns[4] = {4, 5};
    uColumns[5] = {5};
    uColumns[6] = {6};
  } else {
    uColumns[0] = {{0, 1}};
    uColumns[1] = {{1, 1}};
    uColumns[2] = {{2, 1}};
    uColumns[3] = {{3, 1}};
    uColumns[4] = {{4, 1}};
    uColumns[5] = {{3, 4}, {4, 4}, {5, 1}};
    uColumns[6] = {{6, 1}};
  }

  unsigned int i = 0;
  for (auto& c : uColumns) {
    const auto& col = m.get_column(i++, false);  // to force the const version
    test_column_equality<typename Matrix::Column>(c, get_column_content_via_iterators(col));
  }

  if constexpr (Matrix::Option_list::is_z2) {
    BOOST_CHECK(!m.is_zero_entry(3, 5, false));
    BOOST_CHECK(!m.is_zero_column(4, false));
    m.zero_entry(3, 5, false);
    BOOST_CHECK(m.is_zero_entry(3, 5, false));
    BOOST_CHECK(!m.is_zero_column(4, false));
    m.zero_column(4, false);
    BOOST_CHECK(m.is_zero_entry(3, 5, false));
    BOOST_CHECK(m.is_zero_column(4, false));
  } else {
    BOOST_CHECK(!m.is_zero_entry(5, 3, false));
    BOOST_CHECK(!m.is_zero_column(4, false));
    m.zero_entry(5, 3, false);
    BOOST_CHECK(m.is_zero_entry(5, 3, false));
    BOOST_CHECK(!m.is_zero_column(4, false));
    m.zero_column(4, false);
    BOOST_CHECK(m.is_zero_entry(5, 3, false));
    BOOST_CHECK(m.is_zero_column(4, false));
  }
}